

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall
Saturation::SaturationAlgorithm::backwardSimplify(SaturationAlgorithm *this,Clause *cl)

{
  BackwardSimplificationEngine **ppBVar1;
  int iVar2;
  Clause *cl_00;
  Clause *cl_01;
  BwSimplList *pBVar3;
  BwSimplificationRecordIterator simplifications;
  Clause *replacement;
  undefined4 extraout_var;
  
  pBVar3 = this->_bwSimplifiers;
  while (pBVar3 != (BwSimplList *)0x0) {
    ppBVar1 = &pBVar3->_head;
    pBVar3 = pBVar3->_tail;
    simplifications._core = (IteratorCore<Inferences::BwSimplificationRecord> *)0x0;
    (*((*ppBVar1)->super_InferenceEngine)._vptr_InferenceEngine[5])(*ppBVar1,cl,&simplifications);
    while( true ) {
      iVar2 = (*(simplifications._core)->_vptr_IteratorCore[2])();
      if ((char)iVar2 == '\0') break;
      iVar2 = (*(simplifications._core)->_vptr_IteratorCore[3])();
      cl_00 = (Clause *)CONCAT44(extraout_var,iVar2);
      if (cl_01 != (Clause *)0x0) {
        addNewClause(this,cl_01);
      }
      onClauseReduction(this,cl_00,&replacement,1,cl,false);
      cl_00->_refCnt = cl_00->_refCnt + 1;
      removeActiveOrPassiveClause(this,cl_00);
      Kernel::Clause::decRefCnt(cl_00);
    }
    Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator(&simplifications);
  }
  return;
}

Assistant:

void SaturationAlgorithm::backwardSimplify(Clause* cl)
{
  TIME_TRACE("backward simplification");

  BwSimplList::Iterator bsit(_bwSimplifiers);
  while (bsit.hasNext()) {
    BackwardSimplificationEngine *bse = bsit.next();

    BwSimplificationRecordIterator simplifications;
    bse->perform(cl, simplifications);
    while (simplifications.hasNext()) {
      BwSimplificationRecord srec = simplifications.next();
      Clause *redundant = srec.toRemove;
      ASS_NEQ(redundant, cl);

      Clause *replacement = srec.replacement;

      if (replacement) {
        addNewClause(replacement);
      }
      onClauseReduction(redundant, &replacement, 1, cl, false);

      // we must remove the redundant clause before adding its replacement,
      // as otherwise the redundant one might demodulate the replacement into
      // a tautology

      redundant->incRefCnt(); // we don't want the clause deleted before we record the simplification

      removeActiveOrPassiveClause(redundant);

      redundant->decRefCnt();
    }
  }
}